

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_zstd_read_fse(uchar **ppin,uchar *pinend,uint16_t *zdebug_table,int maxidx,
                     elf_zstd_fse_entry *table,int *table_bits)

{
  ushort uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint *puVar13;
  uint16_t uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint *puVar20;
  bool bVar21;
  
  puVar13 = (uint *)*ppin;
  if (pinend <= (byte *)((long)puVar13 + 3U)) {
    return 0;
  }
  puVar20 = puVar13;
  if (((ulong)puVar13 & 3) == 0) {
    uVar19 = 0;
    uVar17 = 0;
  }
  else {
    uVar17 = 0;
    uVar19 = 0;
    do {
      uVar19 = uVar19 | (ulong)(byte)*puVar20 << ((byte)uVar17 & 0x3f);
      uVar17 = uVar17 + 8;
      puVar20 = (uint *)((long)puVar20 + 1);
      puVar13 = (uint *)((long)puVar13 + 1);
    } while (((ulong)puVar13 & 3) != 0);
  }
  if (uVar17 < 0xf) {
    if (3 < (long)pinend - (long)puVar13) {
      uVar19 = uVar19 | (ulong)*puVar20 << ((byte)uVar17 & 0x3f);
      uVar17 = uVar17 | 0x20;
      puVar20 = puVar20 + 1;
      goto LAB_00112f27;
    }
    bVar21 = true;
  }
  else {
LAB_00112f27:
    bVar21 = false;
  }
  if (bVar21) {
    return 0;
  }
  uVar4 = (uint)uVar19 & 0xf;
  iVar15 = uVar4 + 5;
  if (*table_bits < iVar15) {
    return 0;
  }
  *table_bits = iVar15;
  uVar17 = uVar17 - 4;
  if (-1 < maxidx) {
    uVar16 = 0x20 << (sbyte)uVar4;
    uVar7 = uVar16 + 1;
    iVar8 = uVar4 + 6;
    uVar19 = uVar19 >> 4;
    bVar21 = false;
    uVar18 = 0;
LAB_00112f86:
    if (uVar17 < 0xf) {
      if (3 < (long)pinend - (long)puVar20) {
        uVar19 = uVar19 | (ulong)*puVar20 << ((byte)uVar17 & 0x3f);
        uVar17 = uVar17 | 0x20;
        puVar20 = puVar20 + 1;
        goto LAB_00112fbc;
      }
      bVar2 = true;
    }
    else {
LAB_00112fbc:
      bVar2 = false;
    }
    if (!bVar2) {
      if (!bVar21) {
        uVar6 = uVar16 * 2 - 1;
        uVar5 = uVar6 - uVar7;
        uVar10 = uVar16 - 1 & (uint)uVar19;
        if (uVar10 < uVar5) {
          iVar9 = iVar8 + -1;
        }
        else {
          uVar6 = uVar6 & (uint)uVar19;
          if ((int)uVar6 < (int)uVar16) {
            uVar5 = 0;
          }
          uVar10 = uVar6 - uVar5;
          iVar9 = iVar8;
        }
        uVar19 = uVar19 >> ((byte)iVar9 & 0x3f);
        uVar17 = uVar17 - iVar9;
        iVar9 = 1 - uVar10;
        if ((int)uVar10 < 1) {
          iVar9 = -1;
        }
        uVar7 = uVar7 + iVar9;
        zdebug_table[(int)uVar18] = (uint16_t)(uVar10 - 1);
        uVar18 = uVar18 + 1;
        bVar21 = uVar10 - 1 == 0;
        bVar2 = false;
        for (; uVar7 < uVar16; uVar16 = uVar16 >> 1) {
          iVar8 = iVar8 + -1;
        }
        goto LAB_0011310c;
      }
      lVar11 = (long)(int)uVar18;
      iVar9 = -1;
      do {
        if ((~(uint)uVar19 & 0xfff) != 0) goto LAB_001130b6;
        uVar19 = uVar19 >> 0xc;
        uVar17 = uVar17 - 0xc;
        if (uVar17 < 0xf) {
          if (3 < (long)pinend - (long)puVar20) {
            uVar19 = uVar19 | (ulong)*puVar20 << ((byte)uVar17 & 0x3f);
            uVar17 = uVar17 | 0x20;
            puVar20 = puVar20 + 1;
            goto LAB_00113023;
          }
          bVar21 = true;
        }
        else {
LAB_00113023:
          bVar21 = false;
        }
        iVar9 = iVar9 + 0x12;
      } while (!bVar21);
      goto LAB_001130ff;
    }
    bVar2 = true;
    goto LAB_0011310c;
  }
  bVar21 = false;
  uVar18 = 0;
LAB_001131c2:
  if (!bVar21) {
    return 0;
  }
  uVar7 = ~(uVar17 - 8 >> 3);
  if (uVar17 < 8) {
    uVar7 = 0;
  }
  *ppin = (byte *)((long)puVar20 + (long)(int)uVar7);
  if ((int)uVar18 <= maxidx) {
    memset(zdebug_table + (int)uVar18,0,(ulong)(maxidx - uVar18) * 2 + 2);
    uVar18 = maxidx + 1;
  }
  uVar7 = 0x20 << (sbyte)uVar4;
  uVar17 = uVar7 - 1;
  uVar4 = uVar17;
  if (0 < (int)uVar18) {
    uVar19 = 0;
    do {
      uVar14 = zdebug_table[uVar19];
      if ((short)uVar14 < 0) {
        table[(int)uVar4].symbol = (uchar)uVar19;
        uVar4 = uVar4 - 1;
        uVar14 = 1;
      }
      zdebug_table[uVar19 + 0x100] = uVar14;
      uVar19 = uVar19 + 1;
    } while (uVar18 != uVar19);
  }
  if (0 < (int)uVar18) {
    uVar19 = 0;
    uVar16 = 0;
    do {
      uVar14 = zdebug_table[uVar19];
      if (0 < (short)uVar14) {
        iVar8 = 0;
        do {
          table[(int)uVar16].symbol = (uchar)uVar19;
          do {
            uVar16 = uVar16 + (uVar7 >> 3) + (uVar7 >> 1) + 3 & uVar17;
          } while ((int)uVar4 < (int)uVar16);
          iVar8 = iVar8 + 1;
        } while (iVar8 != (short)uVar14);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar18);
    if (uVar16 != 0) {
      return 0;
    }
  }
  uVar19 = 0;
  do {
    uVar1 = zdebug_table[(ulong)table[uVar19].symbol + 0x100];
    zdebug_table[(ulong)table[uVar19].symbol + 0x100] = uVar1 + 1;
    if (uVar1 == 0) {
      return 0;
    }
    iVar8 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    bVar3 = (char)iVar15 - (char)iVar8;
    table[uVar19].bits = bVar3;
    table[uVar19].base = (uVar1 << (bVar3 & 0x1f)) - (short)uVar7;
    uVar19 = uVar19 + 1;
  } while (uVar7 != uVar19);
  return 1;
LAB_001130b6:
  do {
    uVar6 = (uint)uVar19 & 3;
    if (uVar6 != 3) {
      iVar12 = uVar18 + uVar6 + iVar9 + 1;
      uVar19 = uVar19 >> 2;
      uVar17 = uVar17 - 2;
      if (iVar12 <= maxidx) {
        bVar21 = false;
        if ((int)uVar18 < iVar12) {
          memset(zdebug_table + lVar11,0,(ulong)(uVar6 + iVar9) * 2 + 2);
          do {
            lVar11 = lVar11 + 1;
          } while (lVar11 < iVar12);
          uVar18 = (uint)lVar11;
          bVar2 = false;
        }
        else {
          bVar2 = false;
        }
        goto LAB_0011310c;
      }
      break;
    }
    uVar19 = uVar19 >> 2;
    uVar17 = uVar17 - 2;
    if (uVar17 < 0xf) {
      if (3 < (long)pinend - (long)puVar20) {
        uVar19 = uVar19 | (ulong)*puVar20 << ((byte)uVar17 & 0x3f);
        uVar17 = uVar17 | 0x20;
        puVar20 = puVar20 + 1;
        goto LAB_001130f6;
      }
      bVar21 = true;
    }
    else {
LAB_001130f6:
      bVar21 = false;
    }
    iVar9 = iVar9 + 3;
  } while (!bVar21);
LAB_001130ff:
  bVar2 = true;
  bVar21 = true;
LAB_0011310c:
  if (bVar2) {
    return 0;
  }
  if ((uVar7 < 2) || (maxidx < (int)uVar18)) goto LAB_001131ad;
  goto LAB_00112f86;
LAB_001131ad:
  bVar21 = uVar7 == 1;
  goto LAB_001131c2;
}

Assistant:

static int
elf_zstd_read_fse (const unsigned char **ppin, const unsigned char *pinend,
		   uint16_t *zdebug_table, int maxidx,
		   struct elf_zstd_fse_entry *table, int *table_bits)
{
  const unsigned char *pin;
  int16_t *norm;
  uint16_t *next;
  uint64_t val;
  unsigned int bits;
  int accuracy_log;
  uint32_t remaining;
  uint32_t threshold;
  int bits_needed;
  int idx;
  int prev0;

  pin = *ppin;

  norm = (int16_t *) zdebug_table;
  next = zdebug_table + 256;

  if (unlikely (pin + 3 >= pinend))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Align PIN to a 32-bit boundary.  */

  val = 0;
  bits = 0;
  while ((((uintptr_t) pin) & 3) != 0)
    {
      val |= (uint64_t)*pin << bits;
      bits += 8;
      ++pin;
    }

  if (!elf_fetch_bits (&pin, pinend, &val, &bits))
    return 0;

  accuracy_log = (val & 0xf) + 5;
  if (accuracy_log > *table_bits)
    {
      elf_uncompress_failed ();
      return 0;
    }
  *table_bits = accuracy_log;
  val >>= 4;
  bits -= 4;

  /* This code is mostly copied from the reference implementation.  */

  /* The number of remaining probabilities, plus 1.  This sets the number of
     bits that need to be read for the next value.  */
  remaining = (1 << accuracy_log) + 1;

  /* The current difference between small and large values, which depends on
     the number of remaining values.  Small values use one less bit.  */
  threshold = 1 << accuracy_log;

  /* The number of bits used to compute threshold.  */
  bits_needed = accuracy_log + 1;

  /* The next character value.  */
  idx = 0;

  /* Whether the last count was 0.  */
  prev0 = 0;

  while (remaining > 1 && idx <= maxidx)
    {
      uint32_t max;
      int32_t count;

      if (!elf_fetch_bits (&pin, pinend, &val, &bits))
	return 0;

      if (prev0)
	{
	  int zidx;

	  /* Previous count was 0, so there is a 2-bit repeat flag.  If the
	     2-bit flag is 0b11, it adds 3 and then there is another repeat
	     flag.  */
	  zidx = idx;
	  while ((val & 0xfff) == 0xfff)
	    {
	      zidx += 3 * 6;
	      val >>= 12;
	      bits -= 12;
	      if  (!elf_fetch_bits (&pin, pinend, &val, &bits))
		return 0;
	    }
	  while ((val & 3) == 3)
	    {
	      zidx += 3;
	      val >>= 2;
	      bits -= 2;
	      if (!elf_fetch_bits (&pin, pinend, &val, &bits))
		return 0;
	    }
	  /* We have at least 13 bits here, don't need to fetch.  */
	  zidx += val & 3;
	  val >>= 2;
	  bits -= 2;

	  if (unlikely (zidx > maxidx))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }

	  for (; idx < zidx; idx++)
	    norm[idx] = 0;

	  prev0 = 0;
	  continue;
	}

      max = (2 * threshold - 1) - remaining;
      if ((val & (threshold - 1)) < max)
	{
	  /* A small value.  */
	  count = (int32_t) ((uint32_t) val & (threshold - 1));
	  val >>= bits_needed - 1;
	  bits -= bits_needed - 1;
	}
      else
	{
	  /* A large value.  */
	  count = (int32_t) ((uint32_t) val & (2 * threshold - 1));
	  if (count >= (int32_t) threshold)
	    count -= (int32_t) max;
	  val >>= bits_needed;
	  bits -= bits_needed;
	}

      count--;
      if (count >= 0)
	remaining -= count;
      else
	remaining--;
      if (unlikely (idx >= 256))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
      norm[idx] = (int16_t) count;
      ++idx;

      prev0 = count == 0;

      while (remaining < threshold)
	{
	  bits_needed--;
	  threshold >>= 1;
	}
    }

  if (unlikely (remaining != 1))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* If we've read ahead more than a byte, back up.  */
  while (bits >= 8)
    {
      --pin;
      bits -= 8;
    }

  *ppin = pin;

  for (; idx <= maxidx; idx++)
    norm[idx] = 0;

  return elf_zstd_build_fse (norm, idx, next, *table_bits, table);
}